

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

queue_item * cod_find_index_abs(ev_state_data *ev_state,int queue,int index)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  queue_item *ret;
  queue_item *local_8;
  
  local_8 = queue_find_index((queue_item *)**(undefined8 **)(in_RDI + 0x30),in_EDX,(FMFormat)0x0);
  if (local_8 == (queue_item *)0x0) {
    local_8 = (queue_item *)0x0;
  }
  else if ((-1 < in_ESI) &&
          (local_8->item->reference_format !=
           *(FMFormat *)(*(long *)(*(long *)(in_RDI + 0x38) + 0x30) + (long)in_ESI * 8))) {
    local_8 = (queue_item *)0x0;
  }
  return local_8;
}

Assistant:

static queue_item *cod_find_index_abs(struct ev_state_data *ev_state, int queue, int index) {
    queue_item *ret;
    ret = queue_find_index(ev_state->queue->queue_head, index, NULL);
    if (!ret)
        return NULL;
    if (queue < 0 || ret->item->reference_format ==
            ev_state->instance->u.queued.formats[queue])
        return ret;
    else
        return NULL;
}